

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Writer::WriteVRR_External_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  char *pcVar1;
  bool bVar2;
  RRStepType RVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  OSTEI_VRR_Algorithm_Base *pOVar7;
  QAM *am_00;
  ostream *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  StringSet *__range1_1;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  RRStepType rrstep;
  QAM *in_stack_fffffffffffffc48;
  int i;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffc50;
  vector<QAM,_std::allocator<QAM>_> *in_stack_fffffffffffffc60;
  QAM *in_stack_fffffffffffffc98;
  QAM *in_stack_fffffffffffffcf0;
  string local_1f8 [80];
  string *local_1a8;
  _Self local_1a0;
  _Self local_198 [7];
  undefined1 local_160 [48];
  undefined1 *local_130;
  string local_128 [32];
  reference local_108;
  QAM *local_100;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_f8 [7];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  string local_a0 [32];
  string local_80 [100];
  RRStepType local_1c;
  ostream *local_10;
  
  local_10 = in_RSI;
  QAM::QAM((QAM *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  RVar3 = OSTEI_VRR_Algorithm_Base::GetRRStep(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  QAM::~QAM((QAM *)0x143d46);
  local_1c = RVar3;
  poVar5 = std::operator<<(local_10,(string *)indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"VRR_");
  RRStepTypeToStr_abi_cxx11_((RRStepType)((ulong)in_stack_fffffffffffffc98 >> 0x20));
  poVar5 = std::operator<<(poVar5,local_80);
  poVar5 = std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,
                           (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  poVar5 = std::operator<<(poVar5,pcVar1[*piVar6]);
  poVar5 = std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,
                           (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  poVar5 = std::operator<<(poVar5,pcVar1[*piVar6]);
  pOVar7 = (OSTEI_VRR_Algorithm_Base *)std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  am_00 = (QAM *)QAM::operator[]((QAM *)in_stack_fffffffffffffc50,
                                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  poVar5 = std::operator<<((ostream *)pOVar7,pcVar1[(am_00->qam)._M_elems[0]]);
  poVar5 = std::operator<<(poVar5,"_");
  pcVar1 = amchar;
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,
                           (int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  poVar5 = std::operator<<(poVar5,pcVar1[*piVar6]);
  std::operator<<(poVar5,"(\n");
  std::__cxx11::string::~string(local_80);
  poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
  PrimVarName_abi_cxx11_(in_stack_fffffffffffffc98);
  poVar5 = std::operator<<(poVar5,local_a0);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string(local_a0);
  QAM::QAM((QAM *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  OSTEI_VRR_Algorithm_Base::GetAMReq(pOVar7,am_00);
  QAM::~QAM((QAM *)0x14408e);
  local_a8 = local_c0;
  local_f8[0]._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin(in_stack_fffffffffffffc48);
  local_100 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                               ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffc48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       in_stack_fffffffffffffc50,
                       (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       in_stack_fffffffffffffc48);
    if (!bVar2) break;
    local_108 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                operator*(local_f8);
    poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
    PrimVarName_abi_cxx11_(in_stack_fffffffffffffc98);
    poVar5 = std::operator<<(poVar5,local_128);
    std::operator<<(poVar5,",\n");
    std::__cxx11::string::~string(local_128);
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (local_f8);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(in_stack_fffffffffffffc60);
  pOVar7 = *(OSTEI_VRR_Algorithm_Base **)(in_RDI + 8);
  QAM::QAM((QAM *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_(pOVar7,in_stack_fffffffffffffcf0);
  QAM::~QAM((QAM *)0x1442d3);
  local_130 = local_160;
  local_198[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc48);
  local_1a0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc48);
  while( true ) {
    bVar2 = std::operator!=(local_198,&local_1a0);
    RVar3 = (RRStepType)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    if (!bVar2) break;
    local_1a8 = (string *)
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x14436b);
    poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,local_1a8);
    std::operator<<(poVar5,",\n");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffc50);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x144333);
  poVar5 = std::operator<<(local_10,(string *)indent7_abi_cxx11_);
  QAM::QAM((QAM *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  iVar4 = OSTEI_VRR_Algorithm_Base::GetMReq(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  i = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 + 1);
  std::operator<<(poVar5,");\n");
  QAM::~QAM((QAM *)0x1444ab);
  poVar5 = std::operator<<((ostream *)&std::cout,"SIMINT EXTERNAL VRR ");
  RRStepTypeToStr_abi_cxx11_(RVar3);
  poVar5 = std::operator<<(poVar5,local_1f8);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  poVar5 = std::operator<<(poVar5," ");
  piVar6 = QAM::operator[]((QAM *)in_stack_fffffffffffffc50,i);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_1f8);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_External_(std::ostream & os, QAM am) const
{

    // iterate over increasing am
    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    os << indent5 << "VRR_" << RRStepTypeToStr(rrstep) << "_" 
                  << amchar[am[0]] << "_" << amchar[am[1]] << "_"
                  << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    os << indent7 << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        os << indent7 << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
        os << indent7 << it << ",\n";

    os << indent7 << (vrr_algo_.GetMReq(am)+1) << ");\n";

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL VRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << " " << am[2] << " " << am[3] << "\n";
}